

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_dictionary_createWithCapacity(sysbvm_context_t *context,size_t expectedCapacity)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).dictionaryType,2);
  (psVar1->field_1).pointers[0] = 0xb;
  if (99 < expectedCapacity * 0x82) {
    sVar2 = sysbvm_array_create(context,(expectedCapacity * 0x82) / 100);
    psVar1[1].header.field_0.typePointer = sVar2;
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_dictionary_createWithCapacity(sysbvm_context_t *context, size_t expectedCapacity)
{
    size_t requiredStorageCapacity = expectedCapacity * 130 / 100;

    sysbvm_dictionary_t *result = (sysbvm_dictionary_t*)sysbvm_context_allocatePointerTuple(context, context->roots.dictionaryType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_dictionary_t));
    result->size = sysbvm_tuple_size_encode(context, 0);
    if(requiredStorageCapacity > 0)
        result->storage = sysbvm_array_create(context, requiredStorageCapacity);
    return (sysbvm_tuple_t)result;
}